

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmake.h
# Opt level: O1

void __thiscall
CTcMakeDef::CTcMakeDef(CTcMakeDef *this,textchar_t *sym,textchar_t *expan,int is_def)

{
  (this->sym_).buf_ = (textchar_t *)0x0;
  (this->expan_).buf_ = (textchar_t *)0x0;
  CTcMakeStr::set(&this->sym_,sym);
  CTcMakeStr::set(&this->expan_,expan);
  this->field_0x18 = this->field_0x18 & 0xfe | is_def != 0;
  this->nxt_ = (CTcMakeDef *)0x0;
  return;
}

Assistant:

CTcMakeDef(const textchar_t *sym, const textchar_t *expan, int is_def)
    {
        /* remember the symbol and its expansion */
        sym_.set(sym);
        expan_.set(expan);

        /* remember whether it's a definition or un-definition */
        is_def_ = (is_def != 0);

        /* not in a list yet */
        nxt_ = 0;
    }